

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# material.c
# Opt level: O1

void prf_material_entry_f(prf_node_t *node,prf_state_t *state)

{
  prf_node_t **pppVar1;
  
  if (node->opcode == prf_material_info.opcode) {
    pppVar1 = (prf_node_t **)prf_array_append_ptr(state->materials,node);
    state->materials = pppVar1;
    return;
  }
  prf_error(9,"material entry state method tried on node of type %d.");
  return;
}

Assistant:

static
void
prf_material_entry_f(
    prf_node_t * node,
    prf_state_t * state )
{
    assert( node != NULL && state != NULL );

    if ( node->opcode != prf_material_info.opcode ) {
        prf_error( 9, "material entry state method tried on node of type %d.",
            node->opcode );
        return;
    }

    state->materials = (prf_node_t **)prf_array_append_ptr( state->materials, 
							    node );
}